

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O2

POMCPPrior * __thiscall despot::Adventurer::CreatePOMCPPrior(Adventurer *this,string *name)

{
  bool bVar1;
  AdventurerPOMCPPrior *this_00;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"UNIFORM");
  if (bVar1) {
    this_00 = (AdventurerPOMCPPrior *)operator_new(0x78);
    despot::UniformPOMCPPrior::UniformPOMCPPrior((UniformPOMCPPrior *)this_00,(DSPOMDP *)this);
  }
  else {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      bVar1 = std::operator==(name,"RIGHT");
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported POMCP prior: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
    }
    this_00 = (AdventurerPOMCPPrior *)operator_new(0x80);
    AdventurerPOMCPPrior::AdventurerPOMCPPrior(this_00,(DSPOMDP *)this);
  }
  return &this_00->super_POMCPPrior;
}

Assistant:

POMCPPrior* Adventurer::CreatePOMCPPrior(string name) const {
	if (name == "UNIFORM") {
		return new UniformPOMCPPrior(this);
	} else if (name == "DEFAULT" || name == "RIGHT") {
		return new AdventurerPOMCPPrior(this);
	} else {
		cerr << "Unsupported POMCP prior: " << name << endl;
		exit(1);
		return NULL;
	}
}